

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.c
# Opt level: O1

ecs_entity_t
ecs_import(ecs_world_t *world,ecs_module_action_t init_action,char *module_name,void *handles_out,
          size_t handles_size)

{
  char *pcVar1;
  ecs_size_t eVar2;
  ecs_entity_t scope;
  char *path;
  ecs_entity_t entity;
  void *__src;
  
  _ecs_assert((_Bool)(world->in_progress ^ 1),0x19,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/module.c"
              ,0x23);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/module.c"
                  ,0x23,
                  "ecs_entity_t ecs_import(ecs_world_t *, ecs_module_action_t, const char *, void *, size_t)"
                 );
  }
  scope = ecs_set_scope(world,0);
  pcVar1 = world->name_prefix;
  path = ecs_module_path_from_c(module_name);
  entity = ecs_lookup_path_w_sep(world,0,path,".",(char *)0x0);
  (*ecs_os_api.free_)(path);
  if (entity == 0) {
    _ecs_trace(1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/module.c"
               ,0x2d,"import %s");
    ecs_log_push();
    (*init_action)(world);
    entity = ecs_lookup_path_w_sep(world,0,module_name,".",(char *)0x0);
    _ecs_assert(entity != 0,0x12,module_name,"e != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/module.c"
                ,0x35);
    if (entity == 0) {
      __assert_fail("e != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/module.c"
                    ,0x35,
                    "ecs_entity_t ecs_import(ecs_world_t *, ecs_module_action_t, const char *, void *, size_t)"
                   );
    }
    ecs_log_pop();
  }
  if (handles_out != (void *)0x0 && handles_size != 0) {
    __src = ecs_get_mut_w_entity(world,entity,entity,(_Bool *)0x0);
    eVar2 = ecs_from_size_t(handles_size);
    memcpy(handles_out,__src,(long)eVar2);
  }
  ecs_set_scope(world,scope);
  world->name_prefix = pcVar1;
  return entity;
}

Assistant:

ecs_entity_t ecs_import(
    ecs_world_t *world,
    ecs_module_action_t init_action,
    const char *module_name,
    void *handles_out,
    size_t handles_size)
{
    ecs_assert(!world->in_progress, ECS_INVALID_WHILE_ITERATING, NULL);

    ecs_entity_t old_scope = ecs_set_scope(world, 0);
    const char *old_name_prefix = world->name_prefix;

    char *path = ecs_module_path_from_c(module_name);
    ecs_entity_t e = ecs_lookup_fullpath(world, path);
    ecs_os_free(path);
    
    if (!e) {
        ecs_trace_1("import %s", module_name);
        ecs_log_push();

        /* Load module */
        init_action(world);

        /* Lookup module entity (must be registered by module) */
        e = ecs_lookup_fullpath(world, module_name);
        ecs_assert(e != 0, ECS_MODULE_UNDEFINED, module_name);

        ecs_log_pop();
    }

    /* Copy value of module component in handles_out parameter */
    if (handles_size && handles_out) {
        void *handles_ptr = ecs_get_mut_w_entity(world, e, e, NULL);
        ecs_os_memcpy(handles_out, handles_ptr, ecs_from_size_t(handles_size));   
    }

    /* Restore to previous state */
    ecs_set_scope(world, old_scope);
    world->name_prefix = old_name_prefix;

    return e;
}